

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TypeParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&,slang::ast::ForwardTypeRestriction&>
          (BumpAllocator *this,Scope *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          SourceLocation *args_2,bool *args_3,bool *args_4,ForwardTypeRestriction *args_5)

{
  string_view name;
  TypeParameterSymbol *this_00;
  
  this_00 = (TypeParameterSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TypeParameterSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (TypeParameterSymbol *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::TypeParameterSymbol::TypeParameterSymbol(this_00,args,name,*args_2,*args_3,*args_4,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }